

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

void mxx::scatterv<TwoBSA<unsigned_long>>
               (TwoBSA<unsigned_long> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               TwoBSA<unsigned_long> *out,size_t recv_size,int root,comm *comm)

{
  pointer puVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> send_counts;
  datatype dt_1;
  size_t send_size;
  vector<int,_std::allocator<int>_> displs;
  datatype sizedt;
  
  puVar1 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((comm->m_rank == root) &&
     ((long)(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 >> 3 != (long)comm->m_size)) {
    assert_fail("root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
                ,0x13f,"scatterv");
    puVar1 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  iVar2 = 0;
  for (; puVar1 != (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    iVar2 = iVar2 + (int)*puVar1;
  }
  send_size = (size_t)iVar2;
  sizedt._vptr_datatype = (_func_int **)&PTR__datatype_00159940;
  sizedt.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  sizedt.builtin = true;
  MPI_Bcast(&send_size,1,&ompi_mpi_unsigned_long,root,comm->mpi_comm);
  if (send_size < 0x7fffffff) {
    dt_1.mpitype = datatype_contiguous<unsigned_long,_3UL>::get_type();
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00159940;
    dt_1.builtin = false;
    if (comm->m_rank == root) {
      std::vector<int,_std::allocator<int>_>::vector
                (&send_counts,(long)comm->m_size,(allocator_type *)&displs);
      std::
      __copy_move_a<false,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      impl::get_displacements<int>(&displs,&send_counts);
      MPI_Scatterv(msgs,send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                   displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,dt_1.mpitype,out,recv_size & 0xffffffff,
                   dt_1.mpitype,root,comm->mpi_comm);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&displs.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&send_counts.super__Vector_base<int,_std::allocator<int>_>);
    }
    else {
      MPI_Scatterv(0,0,0,&ompi_mpi_datatype_null,out,recv_size & 0xffffffff,dt_1.mpitype,root,
                   comm->mpi_comm);
    }
    datatype::~datatype(&dt_1);
  }
  else {
    impl::scatterv_big<TwoBSA<unsigned_long>>(msgs,sizes,out,recv_size,root,comm);
  }
  datatype::~datatype(&sizedt);
  return;
}

Assistant:

void scatterv(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size()));
    // get total send size
    size_t send_size = std::accumulate(sizes.begin(), sizes.end(), 0);
    mxx::datatype sizedt = mxx::get_datatype<size_t>();
    MPI_Bcast(&send_size, 1, sizedt.type(), root, comm);
    // check if we need to use the custom BIG scatterv
    if (send_size >= mxx::max_int) {
        // own scatter for large messages
        impl::scatterv_big(msgs, sizes, out, recv_size, root, comm);
    } else {
        // regular implementation using integer counts
        mxx::datatype dt = mxx::get_datatype<T>();
        int irecv_size = recv_size;
        if (comm.rank() == root) {
            std::vector<int> send_counts(comm.size());
            std::copy(sizes.begin(), sizes.end(), send_counts.begin());
            std::vector<int> displs = impl::get_displacements(send_counts);
            MPI_Scatterv(const_cast<T*>(msgs), &send_counts[0], &displs[0], dt.type(),
                         out, irecv_size, dt.type(), root, comm);
        } else {
            MPI_Scatterv(NULL, NULL, NULL, MPI_DATATYPE_NULL,
                         out, irecv_size, dt.type(), root, comm);
        }
    }
}